

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O1

int main(void)

{
  int iVar1;
  nn_trie trie;
  nn_trie local_10;
  
  local_10.root = (nn_trie_node *)0x0;
  iVar1 = nn_trie_match(&local_10,"",0);
  if (iVar1 == 0) {
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 != 0) goto LAB_0010387a;
    nn_node_term((nn_trie_node *)0x0);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,"",0);
    if (iVar1 == 0) goto LAB_0010387f;
    iVar1 = nn_trie_match(&local_10,"",0);
    if (iVar1 == 0) goto LAB_00103884;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_00103889;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_0010388e;
    iVar1 = nn_trie_match(&local_10,"DEF",3);
    if (iVar1 != 0) goto LAB_00103893;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"AB",2);
    if (iVar1 != 0) goto LAB_00103898;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_0010389d;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABCDE",5);
    if (iVar1 == 0) goto LAB_001038a2;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"01234567890123456789012345678901234",0x23);
    if (iVar1 == 0) goto LAB_001038a7;
    iVar1 = nn_trie_match(&local_10,"",0);
    if (iVar1 != 0) goto LAB_001038ac;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"012456789",10);
    if (iVar1 != 0) goto LAB_001038b1;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"012345678901234567",0x12);
    if (iVar1 != 0) goto LAB_001038b6;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"01234567890123456789012345678901234",0x23);
    if (iVar1 == 0) goto LAB_001038bb;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_001038c0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ADE",3);
    if (iVar1 == 0) goto LAB_001038c5;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"A",1);
    if (iVar1 != 0) goto LAB_001038ca;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"AD",2);
    if (iVar1 != 0) goto LAB_001038cf;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_001038d4;
    iVar1 = nn_trie_subscribe(&local_10,"B",1);
    if (iVar1 == 0) goto LAB_001038d9;
    iVar1 = nn_trie_subscribe(&local_10,"C",1);
    if (iVar1 == 0) goto LAB_001038de;
    iVar1 = nn_trie_subscribe(&local_10,"0",1);
    if (iVar1 == 0) goto LAB_001038e3;
    iVar1 = nn_trie_subscribe(&local_10,"E",1);
    if (iVar1 == 0) goto LAB_001038e8;
    iVar1 = nn_trie_subscribe(&local_10,"F",1);
    if (iVar1 == 0) goto LAB_001038ed;
    iVar1 = nn_trie_subscribe(&local_10,"1",1);
    if (iVar1 == 0) goto LAB_001038f2;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"@",1);
    if (iVar1 == 0) goto LAB_001038f7;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"b",1);
    if (iVar1 == 0) goto LAB_001038fc;
    iVar1 = nn_trie_subscribe(&local_10,"f",1);
    if (iVar1 == 0) goto LAB_00103901;
    iVar1 = nn_trie_match(&local_10,"0",1);
    if (iVar1 == 0) goto LAB_00103906;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_0010390b;
    iVar1 = nn_trie_match(&local_10,"f",1);
    if (iVar1 == 0) goto LAB_00103910;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"000",3);
    if (iVar1 == 0) goto LAB_00103915;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"a",1);
    if (iVar1 != 0) goto LAB_0010391a;
    iVar1 = nn_trie_match(&local_10,"c",1);
    if (iVar1 != 0) goto LAB_0010391f;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABCD",4);
    if (iVar1 == 0) goto LAB_00103924;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"AB",2);
    if (iVar1 == 0) goto LAB_00103929;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"AB",2);
    if (iVar1 != 1) goto LAB_0010392e;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"AB",2);
    if (iVar1 != 0) goto LAB_00103933;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABCDEF",6);
    if (iVar1 == 0) goto LAB_00103938;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABEF",4);
    if (iVar1 == 0) goto LAB_0010393d;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"ABCD",4);
    if (iVar1 != 1) goto LAB_00103942;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABCD",4);
    if (iVar1 != 0) goto LAB_00103947;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABEF",4);
    if (iVar1 == 0) goto LAB_0010394c;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_00103951;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"A",1);
    if (iVar1 != 1) goto LAB_00103956;
    iVar1 = nn_trie_match(&local_10,"",0);
    if (iVar1 != 0) goto LAB_0010395b;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"A",1);
    if (iVar1 != 0) goto LAB_00103960;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_00103965;
    iVar1 = nn_trie_subscribe(&local_10,"B",1);
    if (iVar1 == 0) goto LAB_0010396a;
    iVar1 = nn_trie_subscribe(&local_10,"C",1);
    if (iVar1 == 0) goto LAB_0010396f;
    iVar1 = nn_trie_subscribe(&local_10,"0",1);
    if (iVar1 == 0) goto LAB_00103974;
    iVar1 = nn_trie_subscribe(&local_10,"E",1);
    if (iVar1 == 0) goto LAB_00103979;
    iVar1 = nn_trie_subscribe(&local_10,"F",1);
    if (iVar1 == 0) goto LAB_0010397e;
    iVar1 = nn_trie_subscribe(&local_10,"1",1);
    if (iVar1 == 0) goto LAB_00103983;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"@",1);
    if (iVar1 == 0) goto LAB_00103988;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"b",1);
    if (iVar1 == 0) goto LAB_0010398d;
    iVar1 = nn_trie_subscribe(&local_10,"f",1);
    if (iVar1 == 0) goto LAB_00103992;
    iVar1 = nn_node_unsubscribe(&local_10.root,"0",1);
    if (iVar1 != 1) goto LAB_00103997;
    iVar1 = nn_node_unsubscribe(&local_10.root,"f",1);
    if (iVar1 != 1) goto LAB_0010399c;
    iVar1 = nn_node_unsubscribe(&local_10.root,"E",1);
    if (iVar1 != 1) goto LAB_001039a1;
    iVar1 = nn_node_unsubscribe(&local_10.root,"B",1);
    if (iVar1 != 1) goto LAB_001039a6;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"A",1);
    if (iVar1 != 1) goto LAB_001039ab;
    iVar1 = nn_node_unsubscribe(&local_10.root,"1",1);
    if (iVar1 != 1) goto LAB_001039b0;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"@",1);
    if (iVar1 != 1) goto LAB_001039b5;
    iVar1 = nn_node_unsubscribe(&local_10.root,"F",1);
    if (iVar1 != 1) goto LAB_001039ba;
    iVar1 = nn_node_unsubscribe(&local_10.root,"C",1);
    if (iVar1 == 1) {
      iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"b",1);
      if (iVar1 == 1) {
        nn_node_term(local_10.root);
        return 0;
      }
      goto LAB_001039c4;
    }
  }
  else {
    main_cold_1();
LAB_0010387a:
    main_cold_2();
LAB_0010387f:
    main_cold_68();
LAB_00103884:
    main_cold_67();
LAB_00103889:
    main_cold_66();
LAB_0010388e:
    main_cold_65();
LAB_00103893:
    main_cold_3();
LAB_00103898:
    main_cold_4();
LAB_0010389d:
    main_cold_64();
LAB_001038a2:
    main_cold_63();
LAB_001038a7:
    main_cold_62();
LAB_001038ac:
    main_cold_5();
LAB_001038b1:
    main_cold_6();
LAB_001038b6:
    main_cold_7();
LAB_001038bb:
    main_cold_61();
LAB_001038c0:
    main_cold_60();
LAB_001038c5:
    main_cold_59();
LAB_001038ca:
    main_cold_8();
LAB_001038cf:
    main_cold_9();
LAB_001038d4:
    main_cold_58();
LAB_001038d9:
    main_cold_57();
LAB_001038de:
    main_cold_56();
LAB_001038e3:
    main_cold_55();
LAB_001038e8:
    main_cold_54();
LAB_001038ed:
    main_cold_53();
LAB_001038f2:
    main_cold_52();
LAB_001038f7:
    main_cold_51();
LAB_001038fc:
    main_cold_50();
LAB_00103901:
    main_cold_49();
LAB_00103906:
    main_cold_48();
LAB_0010390b:
    main_cold_47();
LAB_00103910:
    main_cold_46();
LAB_00103915:
    main_cold_45();
LAB_0010391a:
    main_cold_10();
LAB_0010391f:
    main_cold_11();
LAB_00103924:
    main_cold_44();
LAB_00103929:
    main_cold_43();
LAB_0010392e:
    main_cold_12();
LAB_00103933:
    main_cold_13();
LAB_00103938:
    main_cold_42();
LAB_0010393d:
    main_cold_41();
LAB_00103942:
    main_cold_14();
LAB_00103947:
    main_cold_15();
LAB_0010394c:
    main_cold_40();
LAB_00103951:
    main_cold_39();
LAB_00103956:
    main_cold_16();
LAB_0010395b:
    main_cold_17();
LAB_00103960:
    main_cold_18();
LAB_00103965:
    main_cold_38();
LAB_0010396a:
    main_cold_37();
LAB_0010396f:
    main_cold_36();
LAB_00103974:
    main_cold_35();
LAB_00103979:
    main_cold_34();
LAB_0010397e:
    main_cold_33();
LAB_00103983:
    main_cold_32();
LAB_00103988:
    main_cold_31();
LAB_0010398d:
    main_cold_30();
LAB_00103992:
    main_cold_29();
LAB_00103997:
    main_cold_19();
LAB_0010399c:
    main_cold_20();
LAB_001039a1:
    main_cold_21();
LAB_001039a6:
    main_cold_22();
LAB_001039ab:
    main_cold_23();
LAB_001039b0:
    main_cold_24();
LAB_001039b5:
    main_cold_25();
LAB_001039ba:
    main_cold_26();
  }
  main_cold_27();
LAB_001039c4:
  main_cold_28();
}

Assistant:

int main ()
{
    int rc;
    struct nn_trie trie;

    /*  Try matching with an empty trie. */
    nn_trie_init (&trie);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Try matching with "all" subscription. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try some simple matching. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "DEF", 3);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCDE", 5);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try a long subcsription. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie,
        (const uint8_t*) "01234567890123456789012345678901234", 35);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "012456789", 10);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "012345678901234567", 18);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie,
        (const uint8_t*) "01234567890123456789012345678901234", 35);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try matching with a sparse node involved. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ADE", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "AD", 2);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Try matching with a dense node involved. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "000", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "a", 1);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "c", 1);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Check prefix splitting and compaction. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCDEF", 6);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABEF", 4);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABEF", 4);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Check whether there's no problem with removing all subscriptions. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 0);
    nn_trie_term (&trie);  

    /*  Check converting from sparse node to dense node and vice versa. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    return 0;
}